

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O1

bool __thiscall
CppJieba::HMMSegment::cut
          (HMMSegment *this,const_iterator begin,const_iterator end,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *res)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  words;
  string tmp;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  local_68;
  string local_50;
  
  if ((this->super_SegmentBase)._isInited != false) {
    if (begin._M_current == end._M_current) {
      bVar3 = false;
    }
    else {
      local_68.
      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar3 = cut(this,begin,end,&local_68);
      if (bVar3) {
        paVar1 = &local_50.field_2;
        local_50._M_string_length = 0;
        local_50.field_2._M_local_buf[0] = '\0';
        local_50._M_dataplus._M_p = (pointer)paVar1;
        if (local_68.
            super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_68.
            super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar5 = 0;
          uVar6 = 1;
          do {
            bVar4 = TransCode::encode(local_68.
                                      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + uVar5,&local_50);
            if (bVar4) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(res,&local_50);
            }
            uVar5 = ((long)local_68.
                           super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_68.
                           super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
            bVar4 = uVar6 <= uVar5;
            lVar2 = uVar5 - uVar6;
            uVar5 = uVar6;
            uVar6 = (ulong)((int)uVar6 + 1);
          } while (bVar4 && lVar2 != 0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      std::
      vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ::~vector(&local_68);
    }
    return bVar3;
  }
  __assert_fail("_getInitFlag()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/HMMSegment.hpp"
                ,0x5d,
                "virtual bool CppJieba::HMMSegment::cut(Unicode::const_iterator, Unicode::const_iterator, vector<string> &) const"
               );
}

Assistant:

virtual bool cut(Unicode::const_iterator begin, Unicode::const_iterator end, vector<string>& res)const
            {
				assert(_getInitFlag());
                if(begin == end)
                {
                    return false;
                }
                vector<Unicode> words;
                if(!cut(begin, end, words))
                {
                    return false;
                }
                string tmp;
                for(uint i = 0; i < words.size(); i++)
                {
                    if(TransCode::encode(words[i], tmp))
                    {
                        res.push_back(tmp);
                    }
                }
                return true;
            }